

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O3

void Abc_FlowRetime_AddInitBias(void)

{
  Abc_Ntk_t *pNtk;
  long *plVar1;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pAVar2;
  long *plVar3;
  long lVar4;
  size_t __size;
  uint uVar5;
  uint uVar6;
  Flow_Data_t *pFVar7;
  Vec_Ptr_t *pVVar8;
  uint *__ptr;
  undefined8 *puVar9;
  Vec_Int_t *p;
  int *piVar10;
  void *pvVar11;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long lVar12;
  long extraout_RDX_05;
  long lVar13;
  MinRegMan_t *pMVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  
  pMVar14 = pManMR;
  pNtk = pManMR->pNtk;
  uVar5 = pManMR->vInitConstraints->nSize;
  iVar16 = pManMR->nNodes;
  iVar21 = (pManMR->iteration + 1) * uVar5;
  __size = (long)(iVar21 + iVar16) * 0x18;
  if (pManMR->pDataArray == (Flow_Data_t *)0x0) {
    pFVar7 = (Flow_Data_t *)malloc(__size);
  }
  else {
    pFVar7 = (Flow_Data_t *)realloc(pManMR->pDataArray,__size);
    iVar16 = pManMR->nNodes;
    iVar21 = (pManMR->iteration + 1) * uVar5;
    pMVar14 = pManMR;
  }
  pMVar14->pDataArray = pFVar7;
  memset(pFVar7 + iVar16,0,(long)iVar21 * 0x18);
  if (pMVar14->fVerbose != 0) {
    printf("\t\tcreating %d bias structures\n",(ulong)uVar5);
    pMVar14 = pManMR;
  }
  pVVar8 = pMVar14->vInitConstraints;
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    do {
      plVar1 = (long *)pVVar8->pArray[lVar13];
      if ((*plVar1 == 0) &&
         (Abc_NtkCreateObj(pNtk,ABC_OBJ_BLACKBOX), 0 < *(int *)((long)plVar1 + 0xc))) {
        lVar15 = 0;
        do {
          iVar16 = *(int *)(plVar1[2] + lVar15 * 4);
          if (((long)iVar16 < 0) || (pVVar8 = pNtk->vObjs, pVVar8->nSize <= iVar16)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (*(int *)((long)plVar1 + 0x1c) <= lVar15) {
LAB_0046494f:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pObj = (Abc_Obj_t *)pVVar8->pArray[iVar16];
          iVar16 = *(int *)(plVar1[4] + lVar15 * 4);
          __ptr = (uint *)malloc(0x10);
          *__ptr = 8;
          puVar9 = (undefined8 *)malloc(0x40);
          *(undefined8 **)(__ptr + 2) = puVar9;
          p = (Vec_Int_t *)malloc(0x10);
          p->nCap = 0x10;
          p->nSize = 0;
          piVar10 = (int *)malloc(0x40);
          p->pArray = piVar10;
          pAVar2 = pObj->pNtk;
          *puVar9 = pObj;
          Vec_IntPush(p,0);
          lVar12 = extraout_RDX;
          if ((pAVar2->vTravIds).pArray == (int *)0x0) {
            iVar21 = pAVar2->vObjs->nSize;
            uVar17 = (long)iVar21 + 500;
            iVar18 = (int)uVar17;
            if ((pAVar2->vTravIds).nCap < iVar18) {
              piVar10 = (int *)malloc(uVar17 * 4);
              (pAVar2->vTravIds).pArray = piVar10;
              if (piVar10 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              (pAVar2->vTravIds).nCap = iVar18;
              lVar12 = extraout_RDX_00;
            }
            else {
              piVar10 = (int *)0x0;
            }
            if (-500 < iVar21) {
              memset(piVar10,0,(uVar17 & 0xffffffff) << 2);
              lVar12 = extraout_RDX_01;
            }
            (pAVar2->vTravIds).nSize = iVar18;
          }
          iVar21 = pAVar2->nTravIds;
          pAVar2->nTravIds = iVar21 + 1;
          if (0x3ffffffe < iVar21) {
            __assert_fail("p->nTravIds < (1<<30)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                          ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
          }
          uVar19 = 1;
          uVar17 = 8;
          do {
            if ((int)uVar19 < 1) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
            }
            if (p->nSize < 1) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x396,"int Vec_IntPop(Vec_Int_t *)");
            }
            uVar19 = (ulong)((int)uVar19 - 1);
            plVar3 = *(long **)(*(long *)(__ptr + 2) + uVar19 * 8);
            uVar5 = p->nSize - 1;
            p->nSize = uVar5;
            uVar5 = p->pArray[uVar5];
            lVar20 = *plVar3;
            iVar21 = (int)plVar3[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar20 + 0xe0),iVar21 + 1,(int)lVar12);
            if (((long)iVar21 < 0) || (*(int *)(lVar20 + 0xe4) <= iVar21)) goto LAB_0046494f;
            lVar4 = *plVar3;
            iVar18 = *(int *)(lVar4 + 0xd8);
            lVar12 = extraout_RDX_02;
            if (*(int *)(*(long *)(lVar20 + 0xe8) + (long)iVar21 * 4) != iVar18) {
              iVar21 = (int)plVar3[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar21 + 1,(int)extraout_RDX_02);
              if (((long)iVar21 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar21)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              *(int *)(*(long *)(lVar4 + 0xe8) + (long)iVar21 * 4) = iVar18;
              uVar6 = *(uint *)((long)plVar3 + 0x14) & 0xf;
              lVar12 = extraout_RDX_03;
              if (((uVar6 != 5) && (uVar6 != 8)) &&
                 (iVar21 = Abc_FlowRetime_GetLag(pObj), lVar12 = extraout_RDX_04,
                 iVar21 + uVar5 == iVar16)) {
                *(ushort *)(pManMR->pDataArray + *(uint *)(plVar3 + 2)) =
                     *(ushort *)(pManMR->pDataArray + *(uint *)(plVar3 + 2)) | 0x10;
              }
              iVar21 = *(int *)((long)plVar3 + 0x2c);
              if (0 < iVar21) {
                lVar20 = 0;
                do {
                  lVar12 = (long)*(int *)(plVar3[6] + lVar20 * 4);
                  lVar4 = *(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + lVar12 * 8);
                  uVar6 = *(uint *)(lVar4 + 0x14) & 0xf;
                  if (((uVar6 < 9) && ((0x130U >> uVar6 & 1) != 0)) ||
                     ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 5)) {
                    iVar18 = (int)uVar19;
                    iVar21 = (int)uVar17;
                    if (iVar18 == iVar21) {
                      if (iVar21 < 0x10) {
                        if (*(void **)(__ptr + 2) == (void *)0x0) {
                          pvVar11 = malloc(0x80);
                        }
                        else {
                          pvVar11 = realloc(*(void **)(__ptr + 2),0x80);
                        }
                        *(void **)(__ptr + 2) = pvVar11;
                        *__ptr = 0x10;
                        uVar17 = 0x10;
                      }
                      else {
                        uVar17 = (ulong)(uint)(iVar21 * 2);
                        if (*(void **)(__ptr + 2) == (void *)0x0) {
                          pvVar11 = malloc(uVar17 * 8);
                        }
                        else {
                          pvVar11 = realloc(*(void **)(__ptr + 2),uVar17 * 8);
                        }
                        *(void **)(__ptr + 2) = pvVar11;
                        *__ptr = iVar21 * 2;
                      }
                    }
                    else {
                      pvVar11 = *(void **)(__ptr + 2);
                    }
                    uVar19 = (ulong)(iVar18 + 1);
                    *(long *)((long)pvVar11 + (long)iVar18 * 8) = lVar4;
                    Vec_IntPush(p,(uint)(uVar5 != ((*(uint *)(lVar4 + 0x14) & 0xf) == 8)));
                    iVar21 = *(int *)((long)plVar3 + 0x2c);
                    lVar12 = extraout_RDX_05;
                  }
                  lVar20 = lVar20 + 1;
                } while (lVar20 < iVar21);
              }
            }
          } while ((int)uVar19 != 0);
          if (*(void **)(__ptr + 2) != (void *)0x0) {
            free(*(void **)(__ptr + 2));
          }
          free(__ptr);
          if (p->pArray != (int *)0x0) {
            free(p->pArray);
          }
          free(p);
          lVar15 = lVar15 + 1;
        } while (lVar15 < *(int *)((long)plVar1 + 0xc));
      }
      lVar13 = lVar13 + 1;
      pVVar8 = pManMR->vInitConstraints;
    } while (lVar13 < pVVar8->nSize);
  }
  return;
}

Assistant:

void Abc_FlowRetime_AddInitBias( ) {
  Abc_Ntk_t *pNtk = pManMR->pNtk;
  Abc_Obj_t *pBiasNode, *pObj;
  InitConstraint_t *pConstraint;
  int i, j, id;
  const int nConstraints = Vec_PtrSize( pManMR->vInitConstraints );

  pManMR->pDataArray = ABC_REALLOC( Flow_Data_t, pManMR->pDataArray, pManMR->nNodes + (nConstraints*(pManMR->iteration+1)) );
  memset(pManMR->pDataArray + pManMR->nNodes, 0, sizeof(Flow_Data_t)*(nConstraints*(pManMR->iteration+1)));

  vprintf("\t\tcreating %d bias structures\n", nConstraints);

  Vec_PtrForEachEntry(InitConstraint_t*, pManMR->vInitConstraints, pConstraint, i ) {
    if (pConstraint->pBiasNode) continue;
    
 //   printf("\t\t\tbias %d...\n", i);
    pBiasNode = Abc_NtkCreateBlackbox( pNtk );

    Vec_IntForEachEntry( &pConstraint->vNodes, id, j ) {
      pObj = Abc_NtkObj(pNtk, id);
      Abc_FlowRetime_ConnectBiasNode(pBiasNode, pObj, Vec_IntEntry(&pConstraint->vLags, j));
    }

    // pConstraint->pBiasNode = pBiasNode;
  }
}